

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Itemset.cc
# Opt level: O3

void __thiscall Itemset::print_seq(Itemset *this,ostream *seqstrm,int itempl)

{
  uint uVar1;
  int iVar2;
  element_type *peVar3;
  element_type *peVar4;
  int *piVar5;
  uint uVar6;
  ostream *poVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  
  peVar3 = (this->theItemset).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar4 = (peVar3->theArray).
           super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  piVar5 = *(int **)&peVar4->super__Vector_base<int,_std::allocator<int>_>;
  if (*(pointer *)((long)&peVar4->super__Vector_base<int,_std::allocator<int>_> + 8) == piVar5) {
    uVar8 = 0;
    uVar9 = 0;
  }
  else {
    iVar2 = peVar3->theSize;
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)seqstrm,*piVar5);
    uVar9 = 1;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    uVar1 = iVar2 - 1;
    uVar12 = (ulong)uVar1;
    uVar6 = 1;
    if (2 < iVar2) {
      uVar11 = iVar2 - 2;
      do {
        if (((uint)itempl >> (uVar11 & 0x1f) & 1) != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(seqstrm,"-> ",3);
        }
        peVar4 = (((this->theItemset).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->theArray).
                 super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        lVar10 = *(long *)&peVar4->super__Vector_base<int,_std::allocator<int>_>;
        uVar8 = (long)*(pointer *)((long)&peVar4->super__Vector_base<int,_std::allocator<int>_> + 8)
                - lVar10 >> 2;
        if (uVar8 <= uVar9) goto LAB_00117520;
        poVar7 = (ostream *)
                 std::ostream::operator<<((ostream *)seqstrm,*(int *)(lVar10 + uVar9 * 4));
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
        uVar9 = uVar9 + 1;
        uVar11 = uVar11 - 1;
        uVar6 = uVar1;
      } while (uVar12 != uVar9);
    }
    if (((uint)itempl >> (uVar1 - uVar6 & 0x1f) & 1) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(seqstrm,"-> ",3);
    }
    peVar4 = (((this->theItemset).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             theArray).
             super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    lVar10 = *(long *)&peVar4->super__Vector_base<int,_std::allocator<int>_>;
    uVar8 = (long)*(pointer *)((long)&peVar4->super__Vector_base<int,_std::allocator<int>_> + 8) -
            lVar10 >> 2;
    uVar9 = uVar12;
    if (uVar12 < uVar8) {
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)seqstrm,*(int *)(lVar10 + uVar12 * 4))
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(seqstrm,"-- ",3);
      std::ostream::operator<<((ostream *)seqstrm,this->theSupport);
      if (0 < this->num_class) {
        lVar10 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(seqstrm," ",1);
          std::ostream::operator<<
                    ((ostream *)seqstrm,
                     (this->clsSup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar10]);
          lVar10 = lVar10 + 1;
        } while (lVar10 < this->num_class);
      }
      std::__ostream_insert<char,std::char_traits<char>>(seqstrm," ",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)seqstrm + -0x18) + (char)seqstrm);
      std::ostream::put((char)seqstrm);
      std::ostream::flush();
      return;
    }
  }
LAB_00117520:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar9,uVar8
            );
}

Assistant:

void Itemset::print_seq(ostream& seqstrm, int itempl) {
    int i;
    int sz = size();
    seqstrm << (*theItemset)[0] << " ";
    for (i = 1; i < sz - 1; i++) {
        if (GETBIT(itempl, sz - 1 - i))
            seqstrm << "-> ";
        seqstrm << (*theItemset)[i] << " ";
    }
    if (GETBIT(itempl, sz - 1 - i))
        seqstrm << "-> ";
    seqstrm << (*theItemset)[sz - 1] << " ";
    seqstrm << "-- " << theSupport;
    for (i = 0; i < num_class; i++)
        seqstrm << " " << clsSup[i];
    seqstrm << " ";
//    if (do_print) print_idlist();
    seqstrm << endl;
}